

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

bool Reflection::get<unsigned_int>(Struct *target,string *name,uint *value,size_t offset)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 *puVar4;
  size_t sVar5;
  long lVar6;
  ushort *puVar7;
  uint8_t *address_1;
  size_t target_size;
  type_index tStack_48;
  bool target_is_signed;
  uint8_t *address;
  type_info *target_type;
  size_t offset_local;
  uint *value_local;
  string *name_local;
  Struct *target_local;
  
  target_type = (type_info *)offset;
  offset_local = (size_t)value;
  value_local = (uint *)name;
  name_local = (string *)target;
  iVar2 = (*target->_vptr_Struct[1])(target,name);
  address = (uint8_t *)CONCAT44(extraout_var,iVar2);
  if ((type_info *)address == (type_info *)0x0) {
    target_local._7_1_ = false;
  }
  else {
    bVar1 = std::type_info::operator==((type_info *)address,(type_info *)&unsigned_int::typeinfo);
    if (bVar1) {
      lVar6 = (**(code **)(*(long *)name_local + 0x28))(name_local,value_local);
      *(undefined4 *)offset_local = *(undefined4 *)(lVar6 + (long)target_type * 4);
      target_local._7_1_ = true;
    }
    else {
      std::type_index::type_index(&stack0xffffffffffffffb8,(type_info *)address);
      Enum::name_abi_cxx11_(tStack_48);
      uVar3 = std::__cxx11::string::empty();
      sVar5 = offset_local;
      if ((uVar3 & 1) == 0) {
        puVar4 = (undefined4 *)(**(code **)(*(long *)name_local + 0x28))(name_local,value_local);
        *(undefined4 *)sVar5 = *puVar4;
        target_local._7_1_ = true;
      }
      else {
        bVar1 = TypeInfo::is_integral((type_info *)address);
        if (bVar1) {
          bVar1 = TypeInfo::is_signed((type_info *)address);
          sVar5 = TypeInfo::size((type_info *)address);
          if ((sVar5 < 4) && (!bVar1)) {
            lVar6 = (**(code **)(*(long *)name_local + 0x28))(name_local,value_local);
            puVar7 = (ushort *)(lVar6 + (long)target_type * sVar5);
            bVar1 = std::type_info::operator==
                              ((type_info *)address,(type_info *)&unsigned_char::typeinfo);
            if (bVar1) {
              *(uint *)offset_local = (uint)(byte)*puVar7;
            }
            bVar1 = std::type_info::operator==
                              ((type_info *)address,(type_info *)&signed_char::typeinfo);
            if (bVar1) {
              *(int *)offset_local = (int)(char)(byte)*puVar7;
            }
            bVar1 = std::type_info::operator==
                              ((type_info *)address,(type_info *)&unsigned_short::typeinfo);
            if (bVar1) {
              *(uint *)offset_local = (uint)*puVar7;
            }
            bVar1 = std::type_info::operator==((type_info *)address,(type_info *)&short::typeinfo);
            if (bVar1) {
              *(int *)offset_local = (int)(short)*puVar7;
            }
            bVar1 = std::type_info::operator==
                              ((type_info *)address,(type_info *)&unsigned_int::typeinfo);
            if (bVar1) {
              *(undefined4 *)offset_local = *(undefined4 *)puVar7;
            }
            bVar1 = std::type_info::operator==((type_info *)address,(type_info *)&int::typeinfo);
            if (bVar1) {
              *(undefined4 *)offset_local = *(undefined4 *)puVar7;
            }
            bVar1 = std::type_info::operator==
                              ((type_info *)address,(type_info *)&unsigned_long::typeinfo);
            if (bVar1) {
              *(int *)offset_local = (int)*(undefined8 *)puVar7;
            }
            bVar1 = std::type_info::operator==((type_info *)address,(type_info *)&long::typeinfo);
            if (bVar1) {
              *(int *)offset_local = (int)*(undefined8 *)puVar7;
            }
            return true;
          }
        }
        target_local._7_1_ = false;
      }
    }
  }
  return target_local._7_1_;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}